

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLimitBoneWeights.cpp
# Opt level: O2

void __thiscall
LimitBoneWeightsTest_testProcess_Test::~LimitBoneWeightsTest_testProcess_Test
          (LimitBoneWeightsTest_testProcess_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LimitBoneWeightsTest, testProcess) {
    // execute the step on the given data
    mProcess->ProcessMesh(mMesh);

    // check whether everything is ok ...
    typedef std::vector<LimitBoneWeightsProcess::Weight> VertexWeightList;
    VertexWeightList* asWeights = new VertexWeightList[mMesh->mNumVertices];

    for (unsigned int i = 0; i < mMesh->mNumVertices; ++i) {
        asWeights[i].reserve(4);
    }

    // sort back as per-vertex lists
    for (unsigned int i = 0; i < mMesh->mNumBones;++i) {
        aiBone& pcBone = **(mMesh->mBones+i);
        for (unsigned int q = 0; q < pcBone.mNumWeights;++q) {
            aiVertexWeight weight = pcBone.mWeights[q];
            asWeights[weight.mVertexId].push_back(LimitBoneWeightsProcess::Weight (i,weight.mWeight));
        }
    }

    // now validate the size of the lists and check whether all weights sum to 1.0f
    for (unsigned int i = 0; i < mMesh->mNumVertices;++i) {
        EXPECT_LE(asWeights[i].size(), 4U);
        float fSum = 0.0f;
        for (VertexWeightList::const_iterator iter =  asWeights[i].begin(); iter != asWeights[i].end();++iter) {
            fSum += (*iter).mWeight;
        }
        EXPECT_GE(fSum, 0.95F);
        EXPECT_LE(fSum, 1.04F);
    }

    // delete allocated storage
    delete[] asWeights;

    // everything seems to be OK
}